

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

extent_t *
arena_extent_alloc_large(tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool *zero)

{
  szind_t szind;
  extent_t *peVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t usize_00;
  ulong uVar2;
  _Bool commit;
  extent_hooks_t *extent_hooks;
  _Bool *local_38;
  
  extent_hooks = (extent_hooks_t *)0x0;
  if (usize < 0x1001) {
    szind = (szind_t)sz_size2index_tab[usize + 7 >> 3];
  }
  else {
    szind = sz_size2index_compute(usize);
  }
  commit = true;
  local_38 = zero;
  peVar1 = extents_alloc(tsdn,arena,&extent_hooks,&arena->extents_dirty,(void *)0x0,usize,0x1000,
                         alignment,false,szind,zero,&commit);
  usize_00 = extraout_RDX;
  if (peVar1 == (extent_t *)0x0) {
    if ((arena->decay_muzzy).time_ms.repr == 0) {
      peVar1 = (extent_t *)0x0;
    }
    else {
      peVar1 = extents_alloc(tsdn,arena,&extent_hooks,&arena->extents_muzzy,(void *)0x0,usize,0x1000
                             ,alignment,false,szind,local_38,&commit);
      usize_00 = extraout_RDX_00;
    }
  }
  if (peVar1 == (extent_t *)0x0) {
    peVar1 = extent_alloc_wrapper
                       (tsdn,arena,&extent_hooks,(void *)0x0,usize,0x1000,alignment,false,szind,
                        local_38,&commit);
    usize_00 = extraout_RDX_01;
    uVar2 = usize + 0x1000;
  }
  else {
    uVar2 = 0;
  }
  if (peVar1 != (extent_t *)0x0) {
    arena_large_malloc_stats_update((tsdn_t *)arena,(arena_t *)usize,usize_00);
    if (uVar2 != 0) {
      LOCK();
      (arena->stats).mapped.repr = (arena->stats).mapped.repr + uVar2;
      UNLOCK();
    }
    LOCK();
    (arena->nactive).repr = (arena->nactive).repr + (usize + 0x1000 >> 0xc);
    UNLOCK();
  }
  return peVar1;
}

Assistant:

extent_t *
arena_extent_alloc_large(tsdn_t *tsdn, arena_t *arena, size_t usize,
    size_t alignment, bool *zero) {
	extent_hooks_t *extent_hooks = EXTENT_HOOKS_INITIALIZER;

	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	szind_t szind = sz_size2index(usize);
	size_t mapped_add;
	bool commit = true;
	extent_t *extent = extents_alloc(tsdn, arena, &extent_hooks,
	    &arena->extents_dirty, NULL, usize, sz_large_pad, alignment, false,
	    szind, zero, &commit);
	if (extent == NULL && arena_may_have_muzzy(arena)) {
		extent = extents_alloc(tsdn, arena, &extent_hooks,
		    &arena->extents_muzzy, NULL, usize, sz_large_pad, alignment,
		    false, szind, zero, &commit);
	}
	size_t size = usize + sz_large_pad;
	if (extent == NULL) {
		extent = extent_alloc_wrapper(tsdn, arena, &extent_hooks, NULL,
		    usize, sz_large_pad, alignment, false, szind, zero,
		    &commit);
		if (config_stats) {
			/*
			 * extent may be NULL on OOM, but in that case
			 * mapped_add isn't used below, so there's no need to
			 * conditionlly set it to 0 here.
			 */
			mapped_add = size;
		}
	} else if (config_stats) {
		mapped_add = 0;
	}

	if (extent != NULL) {
		if (config_stats) {
			arena_stats_lock(tsdn, &arena->stats);
			arena_large_malloc_stats_update(tsdn, arena, usize);
			if (mapped_add != 0) {
				arena_stats_add_zu(tsdn, &arena->stats,
				    &arena->stats.mapped, mapped_add);
			}
			arena_stats_unlock(tsdn, &arena->stats);
		}
		arena_nactive_add(arena, size >> LG_PAGE);
	}

	return extent;
}